

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> __thiscall
pfederc::optimize(pfederc *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr
                 ,size_t *reducedexpressions)

{
  ExprType EVar1;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var2;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tVar3;
  ArrayEmptyExpr *local_150;
  ArrayLitExpr *local_140;
  ArrayCpyExpr *local_130;
  BodyExpr *local_120;
  UnOpExpr *local_110;
  BiOpExpr *local_100;
  MatchExpr *local_f0;
  LoopExpr *local_e0;
  IfExpr *local_d0;
  SafeExpr *local_c0;
  ModExpr *local_b0;
  TraitImplExpr *local_a0;
  ClassExpr *local_90;
  LambdaExpr *local_80;
  FuncExpr *local_70;
  ProgramExpr *local_60;
  bool local_31;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_30;
  pointer local_28;
  Expr *pexpr;
  size_t *reducedexpressions_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  
  pexpr = (Expr *)reducedexpressions;
  reducedexpressions_local = (size_t *)expr;
  expr_local = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this;
  local_28 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release(expr);
  EVar1 = Expr::getType(local_28);
  switch(EVar1) {
  case EXPR_PROG:
    if (local_28 == (pointer)0x0) {
      local_60 = (ProgramExpr *)0x0;
    }
    else {
      local_60 = (ProgramExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&ProgramExpr::typeinfo,0);
    }
    tVar3 = optimizeProgramExpr(this,local_60,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_FUNC:
    if (local_28 == (pointer)0x0) {
      local_70 = (FuncExpr *)0x0;
    }
    else {
      local_70 = (FuncExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&FuncExpr::typeinfo,0);
    }
    tVar3 = optimizeFuncExpr(this,local_70,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  default:
    std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
    unique_ptr<std::default_delete<pfederc::Expr>,void>
              ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_30,local_28);
    local_31 = false;
    std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::
    tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool,_true>
              ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> *)
               this,&local_30,&local_31);
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_30);
    _Var2._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
         ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_LAMBDA:
    if (local_28 == (pointer)0x0) {
      local_80 = (LambdaExpr *)0x0;
    }
    else {
      local_80 = (LambdaExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&LambdaExpr::typeinfo,0);
    }
    tVar3 = optimizeLambdaExpr(this,local_80,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_CLASS:
    if (local_28 == (pointer)0x0) {
      local_90 = (ClassExpr *)0x0;
    }
    else {
      local_90 = (ClassExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&ClassExpr::typeinfo,0);
    }
    tVar3 = optimizeClassExpr(this,local_90,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_TRAITIMPL:
    if (local_28 == (pointer)0x0) {
      local_a0 = (TraitImplExpr *)0x0;
    }
    else {
      local_a0 = (TraitImplExpr *)
                 __dynamic_cast(local_28,&Expr::typeinfo,&TraitImplExpr::typeinfo,0);
    }
    tVar3 = optimizeTraitImplExpr(this,local_a0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_MOD:
    if (local_28 == (pointer)0x0) {
      local_b0 = (ModExpr *)0x0;
    }
    else {
      local_b0 = (ModExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&ModExpr::typeinfo,0);
    }
    tVar3 = optimizeModExpr(this,local_b0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_SAFE:
    if (local_28 == (pointer)0x0) {
      local_c0 = (SafeExpr *)0x0;
    }
    else {
      local_c0 = (SafeExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&SafeExpr::typeinfo,0);
    }
    tVar3 = optimizeSafeExpr(this,local_c0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_IF:
    if (local_28 == (pointer)0x0) {
      local_d0 = (IfExpr *)0x0;
    }
    else {
      local_d0 = (IfExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&IfExpr::typeinfo,0);
    }
    tVar3 = optimizeIfExpr(this,local_d0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_LOOP_FOR:
  case EXPR_LOOP_DO:
    if (local_28 == (pointer)0x0) {
      local_e0 = (LoopExpr *)0x0;
    }
    else {
      local_e0 = (LoopExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&LoopExpr::typeinfo,0);
    }
    tVar3 = optimizeLoopExpr(this,local_e0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_MATCH:
    if (local_28 == (pointer)0x0) {
      local_f0 = (MatchExpr *)0x0;
    }
    else {
      local_f0 = (MatchExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&MatchExpr::typeinfo,0);
    }
    tVar3 = optimizeMatchExpr(this,local_f0,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_BIOP:
    if (local_28 == (pointer)0x0) {
      local_100 = (BiOpExpr *)0x0;
    }
    else {
      local_100 = (BiOpExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    }
    tVar3 = optimizeBiOpExpr(this,local_100,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_UNOP:
    if (local_28 == (pointer)0x0) {
      local_110 = (UnOpExpr *)0x0;
    }
    else {
      local_110 = (UnOpExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&UnOpExpr::typeinfo,0);
    }
    tVar3 = optimizeUnOpExpr(this,local_110,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_BODY:
    if (local_28 == (pointer)0x0) {
      local_120 = (BodyExpr *)0x0;
    }
    else {
      local_120 = (BodyExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&BodyExpr::typeinfo,0);
    }
    tVar3 = optimizeBodyExpr(this,local_120,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_ARRLIT:
    if (local_28 == (pointer)0x0) {
      local_140 = (ArrayLitExpr *)0x0;
    }
    else {
      local_140 = (ArrayLitExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&ArrayLitExpr::typeinfo,0)
      ;
    }
    tVar3 = optimizeArrayLitExpr(this,local_140,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_ARRCPY:
    if (local_28 == (pointer)0x0) {
      local_130 = (ArrayCpyExpr *)0x0;
    }
    else {
      local_130 = (ArrayCpyExpr *)__dynamic_cast(local_28,&Expr::typeinfo,&ArrayCpyExpr::typeinfo,0)
      ;
    }
    tVar3 = optimizeArrayCpyExpr(this,local_130,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    break;
  case EXPR_ARREMPTY:
    if (local_28 == (pointer)0x0) {
      local_150 = (ArrayEmptyExpr *)0x0;
    }
    else {
      local_150 = (ArrayEmptyExpr *)
                  __dynamic_cast(local_28,&Expr::typeinfo,&ArrayEmptyExpr::typeinfo,0);
    }
    tVar3 = optimizeArrayEmptyExpr(this,local_150,(size_t *)pexpr);
    _Var2 = tVar3.
            super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
            .
            super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
            ._M_head_impl._M_t.
            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var2._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  _0_8_ = this;
  return (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>)
         tVar3.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
  ;
}

Assistant:

std::tuple<std::unique_ptr<Expr>, bool /* changed */> pfederc::optimize(
    std::unique_ptr<Expr> &&expr, size_t &reducedexpressions) noexcept {
  Expr *pexpr = expr.release();
  switch (pexpr->getType()) {
  case ExprType::EXPR_PROG:
    return optimizeProgramExpr(dynamic_cast<ProgramExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_FUNC:
    return optimizeFuncExpr(dynamic_cast<FuncExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_LAMBDA:
    return optimizeLambdaExpr(dynamic_cast<LambdaExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_CLASS:
    return optimizeClassExpr(dynamic_cast<ClassExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_TRAITIMPL:
    return optimizeTraitImplExpr(dynamic_cast<TraitImplExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_MOD:
    return optimizeModExpr(dynamic_cast<ModExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_SAFE:
    return optimizeSafeExpr(dynamic_cast<SafeExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_IF:
    return optimizeIfExpr(dynamic_cast<IfExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_LOOP_FOR:
  case ExprType::EXPR_LOOP_DO:
    return optimizeLoopExpr(dynamic_cast<LoopExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_MATCH:
    return optimizeMatchExpr(dynamic_cast<MatchExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_BIOP:
    return optimizeBiOpExpr(dynamic_cast<BiOpExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_UNOP:
    return optimizeUnOpExpr(dynamic_cast<UnOpExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_BODY:
    return optimizeBodyExpr(dynamic_cast<BodyExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARRCPY:
    return optimizeArrayCpyExpr(dynamic_cast<ArrayCpyExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARRLIT:
    return optimizeArrayLitExpr(dynamic_cast<ArrayLitExpr*>(pexpr), reducedexpressions);
  case ExprType::EXPR_ARREMPTY:
    return optimizeArrayEmptyExpr(dynamic_cast<ArrayEmptyExpr*>(pexpr), reducedexpressions);
  default:
    return std::tuple<std::unique_ptr<Expr>, bool>(
        std::unique_ptr<Expr>(pexpr), false);
  }
}